

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nxx.cpp
# Opt level: O0

bool mg::data::extract_nxx_header(string_view *in,Nxx *out)

{
  undefined8 uVar1;
  bool bVar2;
  const_pointer pvVar3;
  Nxx *out_local;
  string_view *in_local;
  
  bVar2 = is_nxx_data(in);
  if (bVar2) {
    pvVar3 = std::basic_string_view<char,_std::char_traits<char>_>::data(in);
    uVar1 = *(undefined8 *)pvVar3;
    out->magic[0] = (char)uVar1;
    out->magic[1] = (char)((ulong)uVar1 >> 8);
    out->magic[2] = (char)((ulong)uVar1 >> 0x10);
    out->magic[3] = (char)((ulong)uVar1 >> 0x18);
    out->size = (int)((ulong)uVar1 >> 0x20);
    uVar1 = *(undefined8 *)(pvVar3 + 8);
    out->compressed_size = (int)uVar1;
    out->_padding = (int)((ulong)uVar1 >> 0x20);
    Nxx::to_host_order(out);
  }
  return bVar2;
}

Assistant:

bool extract_nxx_header(const std::string_view &in, Nxx &out) {
  // Does this look like nxx?
  if (!is_nxx_data(in)) {
    return false;
  }

  // Pun header
  out = *reinterpret_cast<const Nxx *>(in.data());
  out.to_host_order();
  return true;
}